

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::IsBlockRequestedFromOutbound
          (PeerManagerImpl *this,uint256 *hash)

{
  long lVar1;
  bool bVar2;
  PeerManagerImpl *this_00;
  element_type *peVar3;
  multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  type *block_it;
  type_conflict5 *nodeid;
  PeerRef peer;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  range;
  __shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  _Self in_stack_ffffffffffffff90;
  byte local_39;
  NodeId in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  ::equal_range(in_RDI,(key_type *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  while (bVar2 = std::operator==((_Self *)in_RDI,
                                 (_Self *)CONCAT17(in_stack_ffffffffffffff87,
                                                   in_stack_ffffffffffffff80)),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    std::
    _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
                  *)in_stack_ffffffffffffff78);
    this_00 = (PeerManagerImpl *)
              std::get<0ul,long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>
                        ((pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_> *)
                         in_stack_ffffffffffffff78);
    std::get<1ul,long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>
              ((pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_> *)
               in_stack_ffffffffffffff78);
    GetPeerRef(this_00,in_stack_ffffffffffffffc8);
    bVar2 = std::__shared_ptr::operator_cast_to_bool(in_stack_ffffffffffffff78);
    if ((bVar2) &&
       (peVar3 = std::
                 __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)in_stack_ffffffffffffff78), (peVar3->m_is_inbound & 1U) == 0)) {
      local_39 = 1;
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
    std::shared_ptr<(anonymous_namespace)::Peer>::~shared_ptr
              ((shared_ptr<(anonymous_namespace)::Peer> *)in_stack_ffffffffffffff78);
    if (bVar2) goto LAB_002c9c70;
    in_stack_ffffffffffffff90 =
         std::
         _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
         ::operator++(in_stack_ffffffffffffff90._M_node,(int)((ulong)in_RDI >> 0x20));
  }
  local_39 = 0;
LAB_002c9c70:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(local_39 & 1);
}

Assistant:

bool PeerManagerImpl::IsBlockRequestedFromOutbound(const uint256& hash)
{
    for (auto range = mapBlocksInFlight.equal_range(hash); range.first != range.second; range.first++) {
        auto [nodeid, block_it] = range.first->second;
        PeerRef peer{GetPeerRef(nodeid)};
        if (peer && !peer->m_is_inbound) return true;
    }

    return false;
}